

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_parse_mem(lys_module *module,lys_submodule *submodule,unres_schema *unres,char *data,
                  uint size_data,lys_node **node)

{
  int iVar1;
  size_t sVar2;
  lys_submodule *local_b0;
  uint local_a8;
  undefined1 local_a0 [8];
  yang_parameter param;
  lys_module *trg;
  yyscan_t pvStack_50;
  int ret;
  yyscan_t scanner;
  YY_BUFFER_STATE bp;
  unres_schema *puStack_38;
  uint size;
  lys_node **node_local;
  char *pcStack_28;
  uint size_data_local;
  char *data_local;
  unres_schema *unres_local;
  lys_submodule *submodule_local;
  lys_module *module_local;
  
  pvStack_50 = (yyscan_t)0x0;
  trg._4_4_ = 0;
  puStack_38 = (unres_schema *)node;
  node_local._4_4_ = size_data;
  pcStack_28 = data;
  data_local = (char *)unres;
  unres_local = (unres_schema *)submodule;
  submodule_local = (lys_submodule *)module;
  local_a8 = size_data;
  if (size_data == 0) {
    sVar2 = strlen(data);
    local_a8 = (int)sVar2 + 2;
  }
  bp._4_4_ = local_a8;
  yylex_init(&stack0xffffffffffffffb0);
  scanner = yy_scan_buffer(pcStack_28,(ulong)bp._4_4_,pvStack_50);
  yy_switch_to_buffer((YY_BUFFER_STATE)scanner,pvStack_50);
  memset(local_a0,0,0x40);
  local_a0 = (undefined1  [8])submodule_local;
  param.module = (lys_module *)unres_local;
  param.submodule = (lys_submodule *)data_local;
  param.unres = puStack_38;
  param.actual_node._0_1_ = (byte)param.actual_node | 1;
  iVar1 = yyparse(pvStack_50,(yang_parameter *)local_a0);
  if (iVar1 != 0) {
    if (((byte)param.actual_node & 1) != 0) {
      if (unres_local == (unres_schema *)0x0) {
        local_b0 = submodule_local;
      }
      else {
        local_b0 = (lys_submodule *)unres_local;
      }
      param._56_8_ = local_b0;
      yang_free_import(local_b0->ctx,local_b0->imp,'\0',local_b0->imp_size);
      yang_free_include(*(ly_ctx **)param._56_8_,*(lys_include **)(param._56_8_ + 0x60),'\0',
                        *(uint8_t *)(param._56_8_ + 0x43));
      *(undefined1 *)(param._56_8_ + 0x43) = 0;
      *(undefined1 *)(param._56_8_ + 0x42) = 0;
    }
    trg._4_4_ = -1;
    if (((byte)param.actual_node & 2) != 0) {
      trg._4_4_ = 1;
    }
  }
  yy_delete_buffer((YY_BUFFER_STATE)scanner,pvStack_50);
  yylex_destroy(pvStack_50);
  return trg._4_4_;
}

Assistant:

int
yang_parse_mem(struct lys_module *module, struct lys_submodule *submodule, struct unres_schema *unres,
               const char *data, unsigned int size_data, struct lys_node **node)
{
    unsigned int size;
    YY_BUFFER_STATE bp;
    yyscan_t scanner = NULL;
    int ret = 0;
    struct lys_module *trg;
    struct yang_parameter param;

    size = (size_data) ? size_data : strlen(data) + 2;
    yylex_init(&scanner);
    bp = yy_scan_buffer((char *)data, size, scanner);
    yy_switch_to_buffer(bp, scanner);
    memset(&param, 0, sizeof param);
    param.module = module;
    param.submodule = submodule;
    param.unres = unres;
    param.node = node;
    param.flags |= YANG_REMOVE_IMPORT;
    if (yyparse(scanner, &param)) {
        if (param.flags & YANG_REMOVE_IMPORT) {
            trg = (submodule) ? (struct lys_module *)submodule : module;
            yang_free_import(trg->ctx, trg->imp, 0, trg->imp_size);
            yang_free_include(trg->ctx, trg->inc, 0, trg->inc_size);
            trg->inc_size = 0;
            trg->imp_size = 0;
        }
        ret = (param.flags & YANG_EXIST_MODULE) ? 1 : -1;
    }
    yy_delete_buffer(bp, scanner);
    yylex_destroy(scanner);
    return ret;
}